

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O0

void run_benchmark(char *name,_func_void_void_ptr_int *benchmark,_func_void_void_ptr *setup,
                  _func_void_void_ptr_int *teardown,void *data,int count,int iter)

{
  int64_t iVar1;
  int64_t iVar2;
  long lVar3;
  code *in_RCX;
  code *in_RDX;
  code *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int in_R9D;
  int64_t total;
  int64_t begin;
  int64_t max;
  int64_t sum;
  int64_t min;
  int i;
  long local_48;
  long local_38;
  int local_30;
  
  local_38 = 0x7fffffffffffffff;
  local_48 = 0;
  for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
    if (in_RDX != (code *)0x0) {
      (*in_RDX)(in_R8);
    }
    iVar1 = gettime_i64();
    (*in_RSI)(in_R8,(undefined4)begin);
    iVar2 = gettime_i64();
    lVar3 = iVar2 - iVar1;
    if (in_RCX != (code *)0x0) {
      (*in_RCX)(in_R8,(undefined4)begin);
    }
    if (lVar3 < local_38) {
      local_38 = lVar3;
    }
    if (local_48 < lVar3) {
      local_48 = lVar3;
    }
  }
  printf("%-30s, ",in_RDI);
  print_number(total);
  printf("   , ");
  print_number(total);
  printf("   , ");
  print_number(total);
  printf("\n");
  return;
}

Assistant:

static void run_benchmark(char *name, void (*benchmark)(void*, int), void (*setup)(void*), void (*teardown)(void*, int), void* data, int count, int iter) {
    int i;
    int64_t min = INT64_MAX;
    int64_t sum = 0;
    int64_t max = 0;
    for (i = 0; i < count; i++) {
        int64_t begin, total;
        if (setup != NULL) {
            setup(data);
        }
        begin = gettime_i64();
        benchmark(data, iter);
        total = gettime_i64() - begin;
        if (teardown != NULL) {
            teardown(data, iter);
        }
        if (total < min) {
            min = total;
        }
        if (total > max) {
            max = total;
        }
        sum += total;
    }
    /* ',' is used as a column delimiter */
    printf("%-30s, ", name);
    print_number(min * FP_MULT / iter);
    printf("   , ");
    print_number(((sum * FP_MULT) / count) / iter);
    printf("   , ");
    print_number(max * FP_MULT / iter);
    printf("\n");
}